

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

EchoCanceller3 * webrtc::Config::default_value<webrtc::EchoCanceller3>(void)

{
  int iVar1;
  EchoCanceller3 *this;
  
  if (default_value<webrtc::EchoCanceller3>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::EchoCanceller3>()::def);
    if (iVar1 != 0) {
      this = (EchoCanceller3 *)operator_new(1);
      EchoCanceller3::EchoCanceller3(this);
      default_value<webrtc::EchoCanceller3>::def = this;
      __cxa_guard_release(&default_value<webrtc::EchoCanceller3>()::def);
    }
  }
  return default_value<webrtc::EchoCanceller3>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }